

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_echo.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  in_addr_t iVar3;
  int iVar4;
  uint uVar5;
  LIBSSH2_SESSION *session;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  char *pcVar12;
  fd_set *__readfds;
  char *unaff_R13;
  char *pcVar13;
  fd_set *__writefds;
  char *exitsignal;
  size_t len;
  int type;
  sockaddr_in sin;
  libssh2_knownhost *host;
  timeval tStack_7e40;
  fd_set fStack_7e30;
  ulong uStack_7da8;
  size_t sStack_7da0;
  LIBSSH2_SESSION *pLStack_7d98;
  code *pcStack_7d90;
  long *local_7d88;
  uint local_7d78;
  uint local_7d74;
  char *local_7d70;
  char *local_7d68;
  undefined8 local_7d60;
  char *local_7d58;
  undefined1 local_7d4c [4];
  sockaddr local_7d48;
  long local_7d38 [4001];
  
  local_7d70 = "none";
  if (((1 < argc) && (hostname = argv[1], argc != 2)) && (username = argv[2], 3 < (uint)argc)) {
    password = argv[3];
  }
  pcStack_7d90 = (code *)0x10262d;
  uVar2 = libssh2_init(0);
  if (uVar2 != 0) {
    pcStack_7d90 = (code *)0x102788;
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar2);
    return 1;
  }
  pcStack_7d90 = (code *)0x102641;
  iVar3 = inet_addr(hostname);
  pcVar12 = (char *)(ulong)iVar3;
  iVar4 = 0;
  pcStack_7d90 = (code *)0x102657;
  uVar2 = socket(2,1,0);
  if (uVar2 == 0xffffffff) {
    pcStack_7d90 = (code *)0x102798;
    main_cold_14();
    goto LAB_00102bbe;
  }
  local_7d48.sa_family = 2;
  local_7d48.sa_data[0] = '\0';
  local_7d48.sa_data[1] = '\x16';
  pcStack_7d90 = (code *)0x10267c;
  local_7d48.sa_data._2_4_ = iVar3;
  iVar4 = connect(uVar2,&local_7d48,0x10);
  if (iVar4 == 0) {
    iVar4 = 0;
    pcStack_7d90 = (code *)0x102694;
    session = (LIBSSH2_SESSION *)libssh2_session_init_ex(0,0,0,0);
    if (session == (LIBSSH2_SESSION *)0x0) {
      pcStack_7d90 = (code *)0x1027af;
      main_cold_13();
    }
    else {
      pcStack_7d90 = (code *)0x1026aa;
      libssh2_session_set_blocking(session,0);
      do {
        pcStack_7d90 = (code *)0x1026b4;
        uVar5 = libssh2_session_handshake(session,uVar2);
      } while (uVar5 == 0xffffffdb);
      if (uVar5 == 0) {
        pcStack_7d90 = (code *)0x1026c9;
        sVar6 = libssh2_knownhost_init(session);
        if (sVar6 == 0) {
          return 2;
        }
        pcStack_7d90 = (code *)0x1026e9;
        libssh2_knownhost_readfile(sVar6,"known_hosts",1);
        pcStack_7d90 = (code *)0x1026fd;
        libssh2_knownhost_writefile(sVar6,"dumpfile",1);
        pcStack_7d90 = (code *)0x10270f;
        lVar7 = libssh2_session_hostkey(session,&local_7d60,local_7d4c);
        if (lVar7 == 0) {
          return 3;
        }
        local_7d88 = local_7d38;
        pcStack_7d90 = (code *)0x102749;
        uVar5 = libssh2_knownhost_checkp(sVar6,hostname,0x16,lVar7,local_7d60,0x10001);
        if ((int)uVar5 < 2) {
          pcVar9 = *(char **)(local_7d38[0] + 0x18);
        }
        else {
          pcVar9 = "<none>";
        }
        pcStack_7d90 = (code *)0x1027ed;
        fprintf(_stderr,"Host check: %d, key: %s\n",(ulong)uVar5,pcVar9);
        pcStack_7d90 = (code *)0x1027f5;
        libssh2_knownhost_free(sVar6);
        if (*password == '\0') {
LAB_00102846:
          pcStack_7d90 = (code *)0x102853;
          libssh2_trace(session,0x200);
          local_7d88 = (long *)((ulong)local_7d88 & 0xffffffff00000000);
          pcStack_7d90 = (code *)0x10287c;
          sVar8 = libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0);
          if (sVar8 == 0) {
            pcVar13 = "session";
            do {
              pcStack_7d90 = (code *)0x102896;
              iVar4 = libssh2_session_last_error(session,0,0,0);
              sVar8 = sVar6;
              if (iVar4 != -0x25) goto LAB_00102bfd;
              pcStack_7d90 = (code *)0x1028a9;
              waitsocket(uVar2,session);
              local_7d88 = (long *)((ulong)local_7d88 & 0xffffffff00000000);
              pcStack_7d90 = (code *)0x1028ce;
              sVar8 = libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0);
            } while (sVar8 == 0);
          }
          pcVar13 = "exec";
          unaff_R13 = "cat";
          while( true ) {
            pcStack_7d90 = (code *)0x1028fd;
            iVar4 = libssh2_channel_process_startup(sVar8,"exec",4,"cat",3);
            if (iVar4 != -0x25) break;
            pcStack_7d90 = (code *)0x10290c;
            waitsocket(uVar2,session);
          }
          if (iVar4 != 0) {
            pcStack_7d90 = (code *)0x102bfd;
            main_cold_12();
LAB_00102bfd:
            pcStack_7d90 = (code *)0x102c02;
            main_cold_3();
            pcVar9 = pcVar13;
            goto LAB_00102c02;
          }
          pcStack_7d90 = (code *)0x10292a;
          memset(local_7d38,0x41,32000);
          pcStack_7d90 = (code *)0x102934;
          pcVar9 = (char *)malloc(0x20);
          if (pcVar9 != (char *)0x0) {
            *pcVar9 = '\x02';
            *(size_t *)(pcVar9 + 8) = sVar8;
            local_7d68 = pcVar9 + 0x10;
            pcVar9[0x10] = '\x05';
            pcVar9[0x11] = '\0';
            pcVar9[0x12] = '\0';
            pcVar9[0x13] = '\0';
            pcVar9[0x14] = '\0';
            pcVar9[0x15] = '\0';
            pcVar9[0x16] = '\0';
            pcVar9[0x17] = '\0';
            pcVar12 = (char *)0x0;
            unaff_R13 = (char *)0x0;
            local_7d74 = 0;
            local_7d78 = 0;
            do {
              do {
                pcStack_7d90 = (code *)0x10297f;
                iVar4 = libssh2_poll(pcVar9,1,10);
              } while (iVar4 < 1);
              bVar1 = false;
              if ((pcVar9[0x18] & 1U) != 0) {
                pcStack_7d90 = (code *)0x1029bb;
                lVar7 = libssh2_channel_read_ex(sVar8,0,local_7d38,32000);
                if (lVar7 == -0x25) {
                  local_7d74 = local_7d74 + 1;
                  pcStack_7d90 = (code *)0x1029e9;
                  fwrite("will read again\n",0x10,1,_stderr);
                }
                else {
                  if (lVar7 < 0) goto LAB_00102c07;
                  unaff_R13 = unaff_R13 + lVar7;
                  pcStack_7d90 = (code *)0x102a77;
                  fprintf(_stderr,"read %ld bytes (%lu in total)\n",lVar7,unaff_R13);
                }
                bVar1 = true;
              }
              if ((pcVar9[0x18] & 4U) != 0) {
                if (pcVar12 < (char *)0x16e360) {
                  uVar10 = 1500000 - (long)pcVar12;
                  if (31999 < uVar10) {
                    uVar10 = 32000;
                  }
                  pcStack_7d90 = (code *)0x102a1e;
                  lVar7 = libssh2_channel_write_ex(sVar8,0,local_7d38,uVar10);
                  if (lVar7 == -0x25) {
                    local_7d78 = local_7d78 + 1;
                    pcStack_7d90 = (code *)0x102a48;
                    fwrite("will write again\n",0x11,1,_stderr);
                  }
                  else {
                    if (lVar7 < 0) goto LAB_00102c11;
                    pcStack_7d90 = (code *)0x102aae;
                    main_cold_8();
                    pcVar12 = local_7d58;
                  }
                }
                else {
                  pcStack_7d90 = (code *)0x102a89;
                  iVar4 = libssh2_channel_send_eof(sVar8);
                  if (iVar4 == -0x25) {
                    pcStack_7d90 = (code *)0x102a93;
                    main_cold_7();
                  }
                  else {
                    if (iVar4 < 0) goto LAB_00102c0c;
                    pcStack_7d90 = (code *)0x102ad1;
                    main_cold_5();
                  }
                }
                bVar1 = true;
              }
            } while ((bVar1) || ((*(ulong *)(pcVar9 + 0x18) & 0x80) == 0));
            while( true ) {
              pcStack_7d90 = (code *)0x102aed;
              iVar4 = libssh2_channel_close(sVar8);
              if (iVar4 != -0x25) break;
              pcStack_7d90 = (code *)0x102ae5;
              waitsocket(uVar2,session);
            }
            if (iVar4 == 0) {
              pcStack_7d90 = (code *)0x102afe;
              uVar5 = libssh2_channel_get_exit_status(sVar8);
              pcVar13 = (char *)(ulong)uVar5;
              local_7d88 = (long *)0x0;
              pcStack_7d90 = (code *)0x102b20;
              libssh2_channel_get_exit_signal(sVar8,&local_7d70,0,0,0,0);
              pcVar9 = local_7d70;
              if (local_7d70 != (char *)0x0) goto LAB_00102b3c;
            }
            else {
              pcVar13 = (char *)0x7f;
              pcVar9 = "none";
LAB_00102b3c:
              pcStack_7d90 = (code *)0x102b54;
              fprintf(_stderr,"\nGot signal: %s\n",pcVar9);
            }
            pcStack_7d90 = (code *)0x102b5c;
            libssh2_channel_free(sVar8);
            pcStack_7d90 = (code *)0x102b7f;
            fprintf(_stderr,"\nrereads: %d rewrites: %d totwritten %lu\n",(ulong)local_7d74,
                    (ulong)local_7d78,pcVar12);
            if (pcVar12 != unaff_R13) goto LAB_00102c1b;
            goto LAB_00102b88;
          }
        }
        else {
          do {
            pcVar9 = username;
            pcStack_7d90 = (code *)0x102810;
            sVar8 = strlen(username);
            unaff_R13 = password;
            pcStack_7d90 = (code *)0x102822;
            sVar6 = strlen(password);
            pcStack_7d90 = (code *)0x102839;
            iVar4 = libssh2_userauth_password_ex
                              (session,pcVar9,sVar8 & 0xffffffff,unaff_R13,sVar6 & 0xffffffff,0);
          } while (iVar4 == -0x25);
          sVar6 = sVar8;
          if (iVar4 == 0) goto LAB_00102846;
LAB_00102c02:
          pcStack_7d90 = (code *)0x102c07;
          main_cold_2();
LAB_00102c07:
          pcStack_7d90 = (code *)0x102c0c;
          main_cold_4();
LAB_00102c0c:
          pcStack_7d90 = (code *)0x102c11;
          main_cold_6();
LAB_00102c11:
          pcStack_7d90 = (code *)0x102c16;
          main_cold_9();
          pcVar13 = pcVar9;
        }
        pcStack_7d90 = (code *)0x102c1b;
        main_cold_11();
LAB_00102c1b:
        iVar11 = (int)pcVar12;
        pcStack_7d90 = waitsocket;
        main_cold_10();
        pcStack_7d90 = (code *)pcVar13;
        pLStack_7d98 = session;
        sStack_7da0 = sVar8;
        uStack_7da8 = (ulong)uVar2;
        tStack_7e40.tv_sec = 10;
        tStack_7e40.tv_usec = 0;
        fStack_7e30.fds_bits[0] = 0;
        fStack_7e30.fds_bits[1] = 0;
        fStack_7e30.fds_bits[2] = 0;
        fStack_7e30.fds_bits[3] = 0;
        fStack_7e30.fds_bits[4] = 0;
        fStack_7e30.fds_bits[5] = 0;
        fStack_7e30.fds_bits[6] = 0;
        fStack_7e30.fds_bits[7] = 0;
        fStack_7e30.fds_bits[8] = 0;
        fStack_7e30.fds_bits[9] = 0;
        fStack_7e30.fds_bits[10] = 0;
        fStack_7e30.fds_bits[0xb] = 0;
        fStack_7e30.fds_bits[0xc] = 0;
        fStack_7e30.fds_bits[0xd] = 0;
        fStack_7e30.fds_bits[0xe] = 0;
        fStack_7e30.fds_bits[0xf] = 0;
        iVar4 = iVar11 + 0x3f;
        if (-1 < iVar11) {
          iVar4 = iVar11;
        }
        fStack_7e30.fds_bits[iVar4 >> 6] =
             fStack_7e30.fds_bits[iVar4 >> 6] | 1L << ((byte)(iVar11 % 0x40) & 0x3f);
        uVar10 = libssh2_session_block_directions(unaff_R13);
        __readfds = &fStack_7e30;
        if ((uVar10 & 1) == 0) {
          __readfds = (fd_set *)0x0;
        }
        __writefds = &fStack_7e30;
        if ((uVar10 & 2) == 0) {
          __writefds = (fd_set *)0x0;
        }
        iVar4 = select(iVar11 + 1,__readfds,__writefds,(fd_set *)0x0,&tStack_7e40);
        return iVar4;
      }
      pcVar13 = (char *)0x0;
      pcStack_7d90 = (code *)0x1027d1;
      fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar5);
LAB_00102b88:
      iVar4 = (int)pcVar13;
      pcStack_7d90 = (code *)0x102ba3;
      libssh2_session_disconnect_ex(session,0xb,"Normal Shutdown","");
      pcStack_7d90 = (code *)0x102bab;
      libssh2_session_free(session);
    }
  }
  else {
    pcStack_7d90 = (code *)0x1027a2;
    main_cold_1();
    iVar4 = 0;
  }
  pcStack_7d90 = (code *)0x102bb7;
  shutdown(uVar2,2);
  pcStack_7d90 = (code *)0x102bbe;
  close(uVar2);
LAB_00102bbe:
  pcStack_7d90 = (code *)0x102bde;
  fwrite("all done\n",9,1,_stderr);
  pcStack_7d90 = (code *)0x102be3;
  libssh2_exit();
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    int exitcode = 0;
    char *exitsignal = (char *)"none";
    size_t len;
    LIBSSH2_KNOWNHOSTS *nh;
    int type;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostname = argv[1];  /* must be ip address only */
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    hostaddr = inet_addr(hostname);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* tell libssh2 we want it all done non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    nh = libssh2_knownhost_init(session);
    if(!nh) {
        /* eeek, do cleanup here */
        return 2;
    }

    /* read all hosts from here */
    libssh2_knownhost_readfile(nh, "known_hosts",
                               LIBSSH2_KNOWNHOST_FILE_OPENSSH);

    /* store all known hosts to here */
    libssh2_knownhost_writefile(nh, "dumpfile",
                                LIBSSH2_KNOWNHOST_FILE_OPENSSH);

    fingerprint = libssh2_session_hostkey(session, &len, &type);
    if(fingerprint) {
        struct libssh2_knownhost *host;
        int check = libssh2_knownhost_checkp(nh, hostname, 22,
                                             fingerprint, len,
                                             LIBSSH2_KNOWNHOST_TYPE_PLAIN|
                                             LIBSSH2_KNOWNHOST_KEYENC_RAW,
                                             &host);

        fprintf(stderr, "Host check: %d, key: %s\n", check,
                (check <= LIBSSH2_KNOWNHOST_CHECK_MISMATCH) ?
                host->key : "<none>");

        /*****
         * At this point, we could verify that 'check' tells us the key is
         * fine or bail out.
         *****/
    }
    else {
        /* eeek, do cleanup here */
        return 3;
    }
    libssh2_knownhost_free(nh);

    if(strlen(password) != 0) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed.\n");
            exit(1);
        }
    }

    libssh2_trace(session, LIBSSH2_TRACE_SOCKET);

    /* Exec non-blocking on the remote host */
    do {
        channel = libssh2_channel_open_session(session);
        if(channel ||
           libssh2_session_last_error(session, NULL, NULL, 0) !=
           LIBSSH2_ERROR_EAGAIN)
            break;
        waitsocket(sock, session);
    } while(1);
    if(!channel) {
        fprintf(stderr, "Error\n");
        exit(1);
    }
    while((rc = libssh2_channel_exec(channel, commandline)) ==
          LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc) {
        fprintf(stderr, "exec error\n");
        exit(1);
    }
    else {
        LIBSSH2_POLLFD *fds = NULL;
        int running = 1;
        size_t bufsize = BUFSIZE;
        char buffer[BUFSIZE];
        size_t totsize = 1500000;
        size_t totwritten = 0;
        size_t totread = 0;
        int rereads = 0;
        int rewrites = 0;
        int i;

        for(i = 0; i < BUFSIZE; i++)
            buffer[i] = 'A';

        fds = malloc(sizeof(LIBSSH2_POLLFD));
        if(!fds) {
            fprintf(stderr, "malloc failed\n");
            exit(1);
        }

        fds[0].type = LIBSSH2_POLLFD_CHANNEL;
        fds[0].fd.channel = channel;
        fds[0].events = LIBSSH2_POLLFD_POLLIN | LIBSSH2_POLLFD_POLLOUT;

        do {
            int act = 0;
            rc = libssh2_poll(fds, 1, 10);

            if(rc < 1)
                continue;

            if(fds[0].revents & LIBSSH2_POLLFD_POLLIN) {
                ssize_t n = libssh2_channel_read(channel,
                                                 buffer, sizeof(buffer));
                act++;

                if(n == LIBSSH2_ERROR_EAGAIN) {
                    rereads++;
                    fprintf(stderr, "will read again\n");
                }
                else if(n < 0) {
                    fprintf(stderr, "read failed\n");
                    exit(1);
                }
                else {
                    totread += (size_t)n;
                    fprintf(stderr, "read %ld bytes (%lu in total)\n",
                            (long)n, (unsigned long)totread);
                }
            }

            if(fds[0].revents & LIBSSH2_POLLFD_POLLOUT) {
                act++;

                if(totwritten < totsize) {
                    /* we have not written all data yet */
                    size_t left = totsize - totwritten;
                    size_t size = (left < bufsize) ? left : bufsize;
                    ssize_t n = libssh2_channel_write_ex(channel, 0,
                                                         buffer, size);

                    if(n == LIBSSH2_ERROR_EAGAIN) {
                        rewrites++;
                        fprintf(stderr, "will write again\n");
                    }
                    else if(n < 0) {
                        fprintf(stderr, "write failed\n");
                        exit(1);
                    }
                    else {
                        totwritten += (size_t)n;
                        fprintf(stderr, "wrote %ld bytes (%lu in total)",
                                (long)n, (unsigned long)totwritten);
                        if(left >= bufsize && (size_t)n != bufsize) {
                            fprintf(stderr, " PARTIAL");
                        }
                        fprintf(stderr, "\n");
                    }
                }
                else {
                    /* all data written, send EOF */
                    rc = libssh2_channel_send_eof(channel);

                    if(rc == LIBSSH2_ERROR_EAGAIN) {
                        fprintf(stderr, "will send eof again\n");
                    }
                    else if(rc < 0) {
                        fprintf(stderr, "send eof failed\n");
                        exit(1);
                    }
                    else {
                        fprintf(stderr, "sent eof\n");
                        /* we're done writing, stop listening for OUT events */
                        fds[0].events &=
                            ~(unsigned long)LIBSSH2_POLLFD_POLLOUT;
                    }
                }
            }

            if(fds[0].revents & LIBSSH2_POLLFD_CHANNEL_CLOSED) {
                if(!act) /* don't leave loop until we have read all data */
                    running = 0;
            }
        } while(running);

        exitcode = 127;
        while((rc = libssh2_channel_close(channel)) == LIBSSH2_ERROR_EAGAIN)
            waitsocket(sock, session);

        if(rc == 0) {
            exitcode = libssh2_channel_get_exit_status(channel);
            libssh2_channel_get_exit_signal(channel, &exitsignal,
                                            NULL, NULL, NULL, NULL, NULL);
        }

        if(exitsignal)
            fprintf(stderr, "\nGot signal: %s\n", exitsignal);

        libssh2_channel_free(channel);
        channel = NULL;

        fprintf(stderr, "\nrereads: %d rewrites: %d totwritten %lu\n",
                rereads, rewrites, (unsigned long)totwritten);

        if(totwritten != totread) {
            fprintf(stderr, "\n*** FAIL bytes written: "
                    "%lu bytes read: %lu ***\n",
                    (unsigned long)totwritten, (unsigned long)totread);
            exit(1);
        }
    }

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return exitcode;
}